

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

void remote_burglary(xchar x,xchar y)

{
  level *lev;
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  monst *mtmp;
  
  lev = level;
  pcVar3 = in_rooms(level,x,y,0x12);
  mtmp = shop_keeper(lev,*pcVar3);
  if (mtmp != (monst *)0x0) {
    iVar2 = inhishop(mtmp);
    if ((iVar2 != 0) &&
       ((*(short *)((long)&mtmp[0x1b].misc_worn_check + 2) != 0 ||
        (*(int *)&mtmp[0x1b].field_0x60 != 0)))) {
      bVar1 = rob_shop(mtmp);
      if (bVar1 != '\0') {
        bVar1 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
        if (bVar1 != '\0') {
          blkmar_guards(mtmp);
        }
        call_kops(mtmp,'\0');
        return;
      }
    }
  }
  return;
}

Assistant:

void remote_burglary(xchar x, xchar y)
{
	struct monst *shkp;
	struct eshk *eshkp;

	shkp = shop_keeper(level, *in_rooms(level, x, y, SHOPBASE));
	if (!shkp || !inhishop(shkp))
	    return;	/* shk died, teleported, changed levels... */

	eshkp = ESHK(shkp);
	if (!eshkp->billct && !eshkp->debit)	/* bill is settled */
	    return;

	if (rob_shop(shkp)) {
	    if (Is_blackmarket(&u.uz))
		blkmar_guards(shkp);
	    /*[might want to set 2nd arg based on distance from shop doorway]*/
	    call_kops(shkp, FALSE);
	}
}